

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

bool recall_tree_ns::is_candidate(recall_tree *b,uint32_t cn,example *ec)

{
  node *pnVar1;
  node_pred *pnVar2;
  uint32_t *puVar3;
  bool bVar4;
  node_pred *pnVar5;
  bool bVar6;
  bool bVar7;
  
  pnVar1 = (b->nodes)._begin;
  pnVar2 = pnVar1[cn].preds._begin;
  pnVar5 = pnVar2;
  do {
    bVar7 = pnVar5 != pnVar1[cn].preds._end;
    bVar6 = pnVar5 < pnVar2 + b->max_candidates;
    bVar4 = bVar6 && bVar7;
    if (!bVar6 || !bVar7) {
      return bVar4;
    }
    puVar3 = &pnVar5->label;
    pnVar5 = pnVar5 + 1;
  } while (*puVar3 != (ec->l).multi.label);
  return bVar4;
}

Assistant:

bool is_candidate(recall_tree& b, uint32_t cn, example& ec)
{
  for (node_pred* ls = b.nodes[cn].preds.begin();
       ls != b.nodes[cn].preds.end() && ls < b.nodes[cn].preds.begin() + b.max_candidates; ++ls)
  {
    if (ls->label == ec.l.multi.label)
      return true;
  }

  return false;
}